

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

CURLcode dohprobe(Curl_easy *data,dnsprobe *p,DNStype dnstype,char *host,char *url,CURLM *multi,
                 curl_slist *headers)

{
  DOHcode DVar1;
  CURLMcode CVar2;
  timediff_t tVar3;
  dynbuf *pdVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  undefined8 uVar10;
  long mask;
  dynbuf *resp;
  DOHcode d;
  timediff_t timeout_ms;
  CURLcode result;
  char *nurl;
  Curl_easy *doh;
  CURLM *multi_local;
  char *url_local;
  char *host_local;
  dnsprobe *pdStack_20;
  DNStype dnstype_local;
  dnsprobe *p_local;
  Curl_easy *data_local;
  
  nurl = (char *)0x0;
  doh = (Curl_easy *)multi;
  multi_local = (CURLM *)url;
  url_local = host;
  host_local._4_4_ = dnstype;
  pdStack_20 = p;
  p_local = (dnsprobe *)data;
  DVar1 = doh_encode(host,dnstype,p->dohbuffer,0x200,&p->dohlen);
  if (DVar1 == DOH_OK) {
    pdStack_20->dnstype = host_local._4_4_;
    Curl_dyn_init(&pdStack_20->serverdoh,3000);
    tVar3 = Curl_timeleft((Curl_easy *)p_local,(curltime *)0x0,true);
    if (tVar3 < 1) {
      timeout_ms._4_4_ = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      timeout_ms._4_4_ = Curl_open((Curl_easy **)&nurl);
      if (timeout_ms._4_4_ == CURLE_OK) {
        pdVar4 = &pdStack_20->serverdoh;
        timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_URL,multi_local);
        if ((((((((((timeout_ms._4_4_ == CURLE_OK) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                  (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                 (((timeout_ms._4_4_ =
                         curl_easy_setopt((Curl_easy *)nurl,CURLOPT_DEFAULT_PROTOCOL,"https"),
                   timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                  (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
                ((((timeout_ms._4_4_ =
                         curl_easy_setopt((Curl_easy *)nurl,CURLOPT_WRITEFUNCTION,doh_write_cb),
                   timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                  (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                 (((timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_WRITEDATA,pdVar4),
                   timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                  (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))) &&
               (((timeout_ms._4_4_ =
                       curl_easy_setopt((Curl_easy *)nurl,CURLOPT_POSTFIELDS,pdStack_20->dohbuffer),
                 timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
              (((((timeout_ms._4_4_ =
                        curl_easy_setopt((Curl_easy *)nurl,CURLOPT_POSTFIELDSIZE,pdStack_20->dohlen)
                  , timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                (((timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_HTTPHEADER,headers)
                  , timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
               (((timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_HTTP_VERSION,4),
                 timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))) &&
             (((timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_PROTOCOLS,2),
               timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
              (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
            (((((timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_TIMEOUT_MS,tVar3),
                timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
               (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
              (((timeout_ms._4_4_ =
                      curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SHARE,
                                       *(undefined8 *)(p_local->dohbuffer + 0xbc)),
                timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
               (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
             (((*(long *)(p_local->dohbuffer + 0x1a4) == 0 ||
               (*(long *)(p_local->dohbuffer + 0x1a4) == _stderr)) ||
              ((timeout_ms._4_4_ =
                     curl_easy_setopt((Curl_easy *)nurl,CURLOPT_STDERR,
                                      *(undefined8 *)(p_local->dohbuffer + 0x1a4)),
               timeout_ms._4_4_ == CURLE_OK ||
               ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))))))) &&
           ((((*(ulong *)(p_local[4].dohbuffer + 0x1a6) >> 0x1b & 1) == 0 ||
             (((timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_VERBOSE,1),
               timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
              (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
            ((((*(ulong *)(p_local[4].dohbuffer + 0x1a6) >> 0x1f & 1) == 0 ||
              (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_NOSIGNAL,1),
              timeout_ms._4_4_ == CURLE_OK)) ||
             ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN || (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION))
             )))))) {
          uVar10 = 0;
          if (((uint)((ulong)*(undefined8 *)(p_local[4].dohbuffer + 0x1a6) >> 0x33) & 1) != 0) {
            uVar10 = 2;
          }
          timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_VERIFYHOST,uVar10);
          if ((((((timeout_ms._4_4_ == CURLE_OK) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
               ((((timeout_ms._4_4_ =
                        curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_VERIFYPEER,
                                         (ulong)(((uint)((ulong)*(undefined8 *)
                                                                 (p_local[4].dohbuffer + 0x1a6) >>
                                                        0x32) & 1) != 0)),
                  timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                (((timeout_ms._4_4_ =
                        curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_VERIFYSTATUS,
                                         (ulong)(((uint)((ulong)*(undefined8 *)
                                                                 (p_local[4].dohbuffer + 0x1a6) >>
                                                        0x34) & 1) != 0)),
                  timeout_ms._4_4_ == CURLE_OK || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))) &&
              ((((p_local[2].dohbuffer[0x17c] >> 1 & 1) == 0 ||
                (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_FALSESTART,1),
                timeout_ms._4_4_ == CURLE_OK)) ||
               ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))) &&
             (((((*(long *)(p_local[3].dohbuffer + 0x15c) == 0 ||
                 (timeout_ms._4_4_ =
                       curl_easy_setopt((Curl_easy *)nurl,CURLOPT_CAINFO,
                                        *(undefined8 *)(p_local[3].dohbuffer + 0x15c)),
                 timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
               (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
              ((((((*(long *)(p_local[4].dohbuffer + 0xec) == 0 ||
                   (timeout_ms._4_4_ =
                         curl_easy_setopt((Curl_easy *)nurl,CURLOPT_CAINFO_BLOB,
                                          *(undefined8 *)(p_local[4].dohbuffer + 0xec)),
                   timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                ((((*(long *)(p_local[3].dohbuffer + 0x14c) == 0 ||
                   (timeout_ms._4_4_ =
                         curl_easy_setopt((Curl_easy *)nurl,CURLOPT_CAPATH,
                                          *(undefined8 *)(p_local[3].dohbuffer + 0x14c)),
                   timeout_ms._4_4_ == CURLE_OK)) ||
                  ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                   (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
                 (((((((*(long *)(p_local[3].dohbuffer + 0x1a4) == 0 ||
                       (timeout_ms._4_4_ =
                             curl_easy_setopt((Curl_easy *)nurl,CURLOPT_CRLFILE,
                                              *(undefined8 *)(p_local[3].dohbuffer + 0x1a4)),
                       timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN))
                     || (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)) &&
                    ((((p_local[2].dohbuffer[0x17c] & 1) == 0 ||
                      (timeout_ms._4_4_ = curl_easy_setopt((Curl_easy *)nurl,CURLOPT_CERTINFO,1),
                      timeout_ms._4_4_ == CURLE_OK)) ||
                     ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                      (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))) &&
                   ((((*(long *)(p_local[2].dohbuffer + 0x144) == 0 ||
                      (timeout_ms._4_4_ =
                            curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_CTX_FUNCTION,
                                             *(undefined8 *)(p_local[2].dohbuffer + 0x144)),
                      timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                    (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))) &&
                  ((((*(long *)(p_local[2].dohbuffer + 0x14c) == 0 ||
                     (timeout_ms._4_4_ =
                           curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_CTX_DATA,
                                            *(undefined8 *)(p_local[2].dohbuffer + 0x14c)),
                     timeout_ms._4_4_ == CURLE_OK)) || (timeout_ms._4_4_ == CURLE_NOT_BUILT_IN)) ||
                   (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))))) &&
               (((*(long *)(p_local[4].dohbuffer + 0x9c) == 0 ||
                 (timeout_ms._4_4_ =
                       curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_EC_CURVES,
                                        *(undefined8 *)(p_local[4].dohbuffer + 0x9c)),
                 timeout_ms._4_4_ == CURLE_OK)) ||
                ((timeout_ms._4_4_ == CURLE_NOT_BUILT_IN ||
                 (timeout_ms._4_4_ == CURLE_UNKNOWN_OPTION)))))))))) {
            uVar5 = 0;
            if ((p_local[2].dohbuffer[0x17c] >> 3 & 1) != 0) {
              uVar5 = 2;
            }
            uVar6 = 0;
            if ((p_local[2].dohbuffer[0x17c] >> 4 & 1) != 0) {
              uVar6 = 4;
            }
            uVar7 = 0;
            if ((p_local[2].dohbuffer[0x17c] >> 5 & 1) != 0) {
              uVar7 = 8;
            }
            uVar8 = 0;
            if ((p_local[2].dohbuffer[0x17c] >> 6 & 1) != 0) {
              uVar8 = 0x10;
            }
            uVar9 = 0;
            if ((char)p_local[2].dohbuffer[0x17c] < '\0') {
              uVar9 = 0x20;
            }
            curl_easy_setopt((Curl_easy *)nurl,CURLOPT_SSL_OPTIONS,
                             (long)(int)((p_local[2].dohbuffer[0x17c] >> 2 & 1) != 0 | uVar5 | uVar6
                                         | uVar7 | uVar8 | uVar9));
            *(code **)(nurl + 0xa68) = doh_done;
            *(dnsprobe **)(nurl + 0xa70) = p_local;
            pdStack_20->easy = (CURL_conflict *)nurl;
            CVar2 = curl_multi_add_handle((Curl_multi *)doh,(Curl_easy *)nurl);
            if (CVar2 == CURLM_OK) {
              (*Curl_cfree)((void *)0x0);
              return CURLE_OK;
            }
          }
        }
      }
    }
    (*Curl_cfree)((void *)0x0);
    Curl_close((Curl_easy **)&nurl);
    data_local._4_4_ = timeout_ms._4_4_;
  }
  else {
    Curl_failf((Curl_easy *)p_local,"Failed to encode DoH packet [%d]",(ulong)DVar1);
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode dohprobe(struct Curl_easy *data,
                         struct dnsprobe *p, DNStype dnstype,
                         const char *host,
                         const char *url, CURLM *multi,
                         struct curl_slist *headers)
{
  struct Curl_easy *doh = NULL;
  char *nurl = NULL;
  CURLcode result = CURLE_OK;
  timediff_t timeout_ms;
  DOHcode d = doh_encode(host, dnstype, p->dohbuffer, sizeof(p->dohbuffer),
                         &p->dohlen);
  if(d) {
    failf(data, "Failed to encode DoH packet [%d]", d);
    return CURLE_OUT_OF_MEMORY;
  }

  p->dnstype = dnstype;
  Curl_dyn_init(&p->serverdoh, DYN_DOH_RESPONSE);

  timeout_ms = Curl_timeleft(data, NULL, TRUE);
  if(timeout_ms <= 0) {
    result = CURLE_OPERATION_TIMEDOUT;
    goto error;
  }
  /* Curl_open() is the internal version of curl_easy_init() */
  result = Curl_open(&doh);
  if(!result) {
    /* pass in the struct pointer via a local variable to please coverity and
       the gcc typecheck helpers */
    struct dynbuf *resp = &p->serverdoh;
    ERROR_CHECK_SETOPT(CURLOPT_URL, url);
    ERROR_CHECK_SETOPT(CURLOPT_DEFAULT_PROTOCOL, "https");
    ERROR_CHECK_SETOPT(CURLOPT_WRITEFUNCTION, doh_write_cb);
    ERROR_CHECK_SETOPT(CURLOPT_WRITEDATA, resp);
    ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDS, p->dohbuffer);
    ERROR_CHECK_SETOPT(CURLOPT_POSTFIELDSIZE, (long)p->dohlen);
    ERROR_CHECK_SETOPT(CURLOPT_HTTPHEADER, headers);
#ifdef USE_HTTP2
    ERROR_CHECK_SETOPT(CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_2TLS);
#endif
#ifndef CURLDEBUG
    /* enforce HTTPS if not debug */
    ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTPS);
#else
    /* in debug mode, also allow http */
    ERROR_CHECK_SETOPT(CURLOPT_PROTOCOLS, CURLPROTO_HTTP|CURLPROTO_HTTPS);
#endif
    ERROR_CHECK_SETOPT(CURLOPT_TIMEOUT_MS, (long)timeout_ms);
    ERROR_CHECK_SETOPT(CURLOPT_SHARE, data->share);
    if(data->set.err && data->set.err != stderr)
      ERROR_CHECK_SETOPT(CURLOPT_STDERR, data->set.err);
    if(data->set.verbose)
      ERROR_CHECK_SETOPT(CURLOPT_VERBOSE, 1L);
    if(data->set.no_signal)
      ERROR_CHECK_SETOPT(CURLOPT_NOSIGNAL, 1L);

    ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYHOST,
      data->set.doh_verifyhost ? 2L : 0L);
    ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYPEER,
      data->set.doh_verifypeer ? 1L : 0L);
    ERROR_CHECK_SETOPT(CURLOPT_SSL_VERIFYSTATUS,
      data->set.doh_verifystatus ? 1L : 0L);

    /* Inherit *some* SSL options from the user's transfer. This is a
       best-guess as to which options are needed for compatibility. #3661

       Note DoH does not inherit the user's proxy server so proxy SSL settings
       have no effect and are not inherited. If that changes then two new
       options should be added to check doh proxy insecure separately,
       CURLOPT_DOH_PROXY_SSL_VERIFYHOST and CURLOPT_DOH_PROXY_SSL_VERIFYPEER.
       */
    if(data->set.ssl.falsestart)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_FALSESTART, 1L);
    if(data->set.str[STRING_SSL_CAFILE]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAINFO,
                         data->set.str[STRING_SSL_CAFILE]);
    }
    if(data->set.blobs[BLOB_CAINFO]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAINFO_BLOB,
                         data->set.blobs[BLOB_CAINFO]);
    }
    if(data->set.str[STRING_SSL_CAPATH]) {
      ERROR_CHECK_SETOPT(CURLOPT_CAPATH,
                         data->set.str[STRING_SSL_CAPATH]);
    }
    if(data->set.str[STRING_SSL_CRLFILE]) {
      ERROR_CHECK_SETOPT(CURLOPT_CRLFILE,
                         data->set.str[STRING_SSL_CRLFILE]);
    }
    if(data->set.ssl.certinfo)
      ERROR_CHECK_SETOPT(CURLOPT_CERTINFO, 1L);
    if(data->set.ssl.fsslctx)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_FUNCTION, data->set.ssl.fsslctx);
    if(data->set.ssl.fsslctxp)
      ERROR_CHECK_SETOPT(CURLOPT_SSL_CTX_DATA, data->set.ssl.fsslctxp);
    if(data->set.str[STRING_SSL_EC_CURVES]) {
      ERROR_CHECK_SETOPT(CURLOPT_SSL_EC_CURVES,
                         data->set.str[STRING_SSL_EC_CURVES]);
    }

    {
      long mask =
        (data->set.ssl.enable_beast ?
         CURLSSLOPT_ALLOW_BEAST : 0) |
        (data->set.ssl.no_revoke ?
         CURLSSLOPT_NO_REVOKE : 0) |
        (data->set.ssl.no_partialchain ?
         CURLSSLOPT_NO_PARTIALCHAIN : 0) |
        (data->set.ssl.revoke_best_effort ?
         CURLSSLOPT_REVOKE_BEST_EFFORT : 0) |
        (data->set.ssl.native_ca_store ?
         CURLSSLOPT_NATIVE_CA : 0) |
        (data->set.ssl.auto_client_cert ?
         CURLSSLOPT_AUTO_CLIENT_CERT : 0);

      (void)curl_easy_setopt(doh, CURLOPT_SSL_OPTIONS, mask);
    }

    doh->set.fmultidone = doh_done;
    doh->set.dohfor = data; /* identify for which transfer this is done */
    p->easy = doh;

    /* DoH private_data must be null because the user must have a way to
       distinguish their transfer's handle from DoH handles in user
       callbacks (ie SSL CTX callback). */
    DEBUGASSERT(!doh->set.private_data);

    if(curl_multi_add_handle(multi, doh))
      goto error;
  }
  else
    goto error;
  free(nurl);
  return CURLE_OK;

  error:
  free(nurl);
  Curl_close(&doh);
  return result;
}